

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mounts.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Mounts::readConfiguration
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Mounts *this,SecretMount *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  long *plVar2;
  ulong *puVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  Path local_88;
  Url local_68;
  string local_48;
  
  client = *(Client **)this;
  Vault::operator+(&local_48,"mounts/",path);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  puVar3 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar3) {
    local_98._M_allocated_capacity = *puVar3;
    local_98._8_8_ = plVar2[3];
    local_a8 = &local_98;
  }
  else {
    local_98._M_allocated_capacity = *puVar3;
    local_a8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar2;
  }
  local_88.value_._M_string_length = plVar2[1];
  *plVar2 = (long)puVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  paVar1 = &local_88.value_.field_2;
  if (local_a8 == &local_98) {
    local_88.value_.field_2._8_8_ = local_98._8_8_;
    local_88.value_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_88.value_._M_dataplus._M_p = (pointer)local_a8;
  }
  local_88.value_.field_2._M_allocated_capacity = local_98._M_allocated_capacity;
  local_98._M_allocated_capacity = local_98._M_allocated_capacity & 0xffffffffffffff00;
  getUrl(&local_68,this,&local_88);
  HttpConsumer::get(__return_storage_ptr__,client,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.value_._M_dataplus._M_p != &local_68.value_.field_2) {
    operator_delete(local_68.value_._M_dataplus._M_p,
                    local_68.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_88.value_._M_dataplus._M_p,
                    local_88.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Sys::Mounts::readConfiguration(const SecretMount &path) const {
  return HttpConsumer::get(client_, getUrl(Path{"mounts/" + path + "/tune"}));
}